

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cswCut.c
# Opt level: O1

Aig_Obj_t * Csw_ObjSweep(Csw_Man_t *p,Aig_Obj_t *pObj,int fTriv)

{
  char cVar1;
  Vec_Ptr_t *pVVar2;
  uint *puVar3;
  int iVar4;
  int iVar5;
  Aig_Obj_t *pAVar6;
  void *pvVar7;
  int i;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  Csw_Cut_t *pCut;
  long lVar11;
  long lVar12;
  Csw_Cut_t *pCVar13;
  Csw_Cut_t *pCut1;
  int iVar14;
  timespec ts;
  timespec local_68;
  Csw_Cut_t *local_58;
  Aig_Obj_t *local_50;
  Aig_Obj_t *local_48;
  uint *local_40;
  ulong local_38;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                  ,0x1f7,"Aig_Obj_t *Csw_ObjSweep(Csw_Man_t *, Aig_Obj_t *, int)");
  }
  if ((*(uint *)&pObj->field_0x18 & 7) - 7 < 0xfffffffe) {
    return pObj;
  }
  if (p->pCuts[pObj->Id] != (Csw_Cut_t *)0x0) {
    return pObj;
  }
  pAVar6 = pObj->pFanin0;
  local_48 = pObj->pFanin1;
  local_50 = pObj;
  Csw_ObjPrepareCuts(p,pObj,fTriv);
  if (0 < p->nCutsMax) {
    local_48 = (Aig_Obj_t *)((ulong)local_48 & 0xfffffffffffffffe);
    pCVar13 = p->pCuts[*(int *)(((ulong)pAVar6 & 0xfffffffffffffffe) + 0x24)];
    uVar10 = 0;
    do {
      local_38 = uVar10;
      if (('\0' < pCVar13->nFanins) && (iVar4 = p->nCutsMax, 0 < iVar4)) {
        pCut1 = p->pCuts[local_48->Id];
        iVar14 = 0;
        pAVar6 = local_50;
        local_58 = pCVar13;
        do {
          if (('\0' < pCut1->nFanins) &&
             (uVar8 = pCut1->uSign | pCVar13->uSign,
             uVar8 = (uVar8 >> 1 & 0x55555555) + (uVar8 & 0x55555555),
             uVar8 = (uVar8 >> 2 & 0x33333333) + (uVar8 & 0x33333333),
             uVar8 = (uVar8 >> 4 & 0x7070707) + (uVar8 & 0x7070707),
             uVar8 = (uVar8 >> 8 & 0xf000f) + (uVar8 & 0xf000f),
             (int)((uVar8 >> 0x10) + (uVar8 & 0xffff)) <= p->nLeafMax)) {
            if (iVar4 < 1) {
              pCVar13 = (Csw_Cut_t *)0x0;
            }
            else {
              pCut = p->pCuts[pAVar6->Id];
              pCVar13 = (Csw_Cut_t *)0x0;
              do {
                if (pCut->nFanins == '\0') goto LAB_004e959e;
                if ((pCVar13 == (Csw_Cut_t *)0x0) || (pCVar13->Cost < pCut->Cost)) {
                  pCVar13 = pCut;
                }
                pCut = (Csw_Cut_t *)((long)&pCut->pNext + (long)pCut->nCutSize);
                iVar4 = iVar4 + -1;
              } while (iVar4 != 0);
            }
            if (pCVar13 == (Csw_Cut_t *)0x0) {
              __assert_fail("pCutMax != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                            ,0x69,"Csw_Cut_t *Csw_CutFindFree(Csw_Man_t *, Aig_Obj_t *)");
            }
            pCVar13->nFanins = '\0';
            pCut = pCVar13;
LAB_004e959e:
            iVar4 = clock_gettime(3,&local_68);
            if (iVar4 < 0) {
              lVar11 = 1;
            }
            else {
              lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
              lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_68.tv_sec * -1000000;
            }
            iVar4 = Csw_CutMerge(p,local_58,pCut1,pCut);
            if (iVar4 == 0) {
              pCVar13 = local_58;
              if (pCut->nFanins != '\0') {
                __assert_fail("pCut->nFanins == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                              ,0x212,"Aig_Obj_t *Csw_ObjSweep(Csw_Man_t *, Aig_Obj_t *, int)");
              }
            }
            else {
              iVar4 = Csw_CutFilter(p,pAVar6,pCut);
              if (iVar4 == 0) {
                local_40 = Csw_CutComputeTruth(p,pCut,local_58,pCut1,*(uint *)&pAVar6->pFanin0 & 1,
                                               *(uint *)&pAVar6->pFanin1 & 1);
                cVar1 = pCut->nFanins;
                iVar4 = Kit_TruthSupportSize(local_40,p->nLeafMax);
                iVar5 = clock_gettime(3,&local_68);
                puVar3 = local_40;
                if (iVar5 < 0) {
                  lVar12 = -1;
                }
                else {
                  lVar12 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
                }
                p->timeCuts = p->timeCuts + lVar12 + lVar11;
                if (iVar4 == 1) {
                  p->nNodesTriv1 = p->nNodesTriv1 + 1;
                  uVar8 = Kit_TruthSupport(local_40,p->nLeafMax);
                  uVar9 = 0;
                  goto LAB_004e99be;
                }
                if (iVar4 == 0) {
                  p->nNodesTriv0 = p->nNodesTriv0 + 1;
                  return (Aig_Obj_t *)((ulong)(*local_40 & 1) ^ (ulong)p->pManRes->pConst1 ^ 1);
                }
                if (((iVar4 == 2) && ('\x02' < cVar1)) &&
                   (pAVar6 = Csw_ObjTwoVarCut(p,pCut), pAVar6 != (Aig_Obj_t *)0x0)) {
                  p->nNodesTriv2 = p->nNodesTriv2 + 1;
                  return pAVar6;
                }
                iVar4 = clock_gettime(3,&local_68);
                if (iVar4 < 0) {
                  lVar11 = 1;
                }
                else {
                  lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
                  lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_68.tv_sec * -1000000;
                }
                if (pCut->nFanins < '\x03') {
                  pAVar6 = (Aig_Obj_t *)0x0;
                }
                else {
                  pAVar6 = Csw_TableCutLookup(p,pCut);
                }
                iVar4 = clock_gettime(3,&local_68);
                if (iVar4 < 0) {
                  lVar12 = -1;
                }
                else {
                  lVar12 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
                }
                p->timeHash = p->timeHash + lVar12 + lVar11;
                if (pAVar6 != (Aig_Obj_t *)0x0) {
                  p->nNodesCuts = p->nNodesCuts + 1;
                  return pAVar6;
                }
                cVar1 = pCut->nFanins;
                if ((long)cVar1 < 1) {
                  __assert_fail("pCut->nFanins > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                                ,0x31,"int Csw_CutFindCost(Csw_Man_t *, Csw_Cut_t *)");
                }
                pVVar2 = p->pManRes->vObjs;
                lVar11 = 0;
                iVar4 = 0;
                do {
                  if (pVVar2 == (Vec_Ptr_t *)0x0) {
                    pvVar7 = (void *)0x0;
                  }
                  else {
                    uVar8 = *(uint *)((long)&pCut[1].pNext + lVar11 * 4);
                    if (((int)uVar8 < 0) || (pVVar2->nSize <= (int)uVar8)) goto LAB_004e9a28;
                    pvVar7 = pVVar2->pArray[uVar8];
                  }
                  if (pvVar7 == (void *)0x0) break;
                  iVar4 = iVar4 + p->pnRefs[*(int *)((long)pvVar7 + 0x24)];
                  lVar11 = lVar11 + 1;
                } while (cVar1 != lVar11);
                iVar4 = (iVar4 * 100) / (int)cVar1;
                pCut->Cost = iVar4;
                pCVar13 = local_58;
                pAVar6 = local_50;
                if (iVar4 < 1) {
                  __assert_fail("pCut->Cost > 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                                ,0x246,"Aig_Obj_t *Csw_ObjSweep(Csw_Man_t *, Aig_Obj_t *, int)");
                }
              }
              else {
                pCVar13 = local_58;
                if (pCut->nFanins != '\0') {
                  __assert_fail("pCut->nFanins == 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                                ,0x218,"Aig_Obj_t *Csw_ObjSweep(Csw_Man_t *, Aig_Obj_t *, int)");
                }
              }
            }
          }
          iVar14 = iVar14 + 1;
          pCut1 = (Csw_Cut_t *)((long)&pCut1->pNext + (long)pCut1->nCutSize);
          iVar4 = p->nCutsMax;
        } while (iVar14 < iVar4);
      }
      uVar8 = (int)local_38 + 1;
      uVar10 = (ulong)uVar8;
      pCVar13 = (Csw_Cut_t *)((long)&pCVar13->pNext + (long)pCVar13->nCutSize);
    } while ((int)uVar8 < p->nCutsMax);
  }
  p->nNodesTried = p->nNodesTried + 1;
  iVar4 = clock_gettime(3,&local_68);
  if (iVar4 < 0) {
    lVar11 = 1;
  }
  else {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_68.tv_nsec),8);
    lVar11 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_68.tv_sec * -1000000;
  }
  if (0 < p->nCutsMax) {
    pCVar13 = p->pCuts[local_50->Id];
    iVar4 = 0;
    do {
      if ('\x02' < pCVar13->nFanins) {
        if (pCVar13->Cost < 1) {
          __assert_fail("pCut->Cost > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                        ,0x250,"Aig_Obj_t *Csw_ObjSweep(Csw_Man_t *, Aig_Obj_t *, int)");
        }
        Csw_TableCutInsert(p,pCVar13);
      }
      iVar4 = iVar4 + 1;
      pCVar13 = (Csw_Cut_t *)((long)&pCVar13->pNext + (long)pCVar13->nCutSize);
    } while (iVar4 < p->nCutsMax);
  }
  iVar4 = clock_gettime(3,&local_68);
  if (iVar4 < 0) {
    lVar12 = -1;
  }
  else {
    lVar12 = local_68.tv_nsec / 1000 + local_68.tv_sec * 1000000;
  }
  p->timeHash = p->timeHash + lVar12 + lVar11;
  return local_50;
  while (uVar9 = uVar9 + 1, uVar9 != 0x20) {
LAB_004e99be:
    if ((uVar8 >> (uVar9 & 0x1f) & 1) != 0) goto LAB_004e99cf;
  }
  uVar9 = 0xffffffff;
LAB_004e99cf:
  if ((int)pCut->nFanins <= (int)uVar9) {
    __assert_fail("iVar < pCut->nFanins",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/csw/cswCut.c"
                  ,0x22d,"Aig_Obj_t *Csw_ObjSweep(Csw_Man_t *, Aig_Obj_t *, int)");
  }
  pVVar2 = p->pManRes->vObjs;
  if (pVVar2 == (Vec_Ptr_t *)0x0) {
    pvVar7 = (void *)0x0;
  }
  else {
    uVar8 = *(uint *)((long)&pCut[1].pNext + (long)(int)uVar9 * 4);
    if (((int)uVar8 < 0) || (pVVar2->nSize <= (int)uVar8)) {
LAB_004e9a28:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pvVar7 = pVVar2->pArray[uVar8];
  }
  return (Aig_Obj_t *)((ulong)(*puVar3 & 1) ^ (ulong)pvVar7);
}

Assistant:

Aig_Obj_t * Csw_ObjSweep( Csw_Man_t * p, Aig_Obj_t * pObj, int fTriv )
{
    int fUseResub = 1;
    Csw_Cut_t * pCut0, * pCut1, * pCut, * pCutSet;
    Aig_Obj_t * pFanin0 = Aig_ObjFanin0(pObj);
    Aig_Obj_t * pFanin1 = Aig_ObjFanin1(pObj);
    Aig_Obj_t * pObjNew;
    unsigned * pTruth;
    int i, k, nVars, nFanins, iVar;
    abctime clk;

    assert( !Aig_IsComplement(pObj) );
    if ( !Aig_ObjIsNode(pObj) )
        return pObj;
    if ( Csw_ObjCuts(p, pObj) )
        return pObj;
    // the node is not processed yet
    assert( Csw_ObjCuts(p, pObj) == NULL );
    assert( Aig_ObjIsNode(pObj) );

    // set up the first cut
    pCutSet = Csw_ObjPrepareCuts( p, pObj, fTriv );

    // compute pair-wise cut combinations while checking table
    Csw_ObjForEachCut( p, pFanin0, pCut0, i )
    if ( pCut0->nFanins > 0 )
    Csw_ObjForEachCut( p, pFanin1, pCut1, k )
    if ( pCut1->nFanins > 0 )
    {
        // make sure K-feasible cut exists
        if ( Kit_WordCountOnes(pCut0->uSign | pCut1->uSign) > p->nLeafMax )
            continue;
        // get the next cut of this node
        pCut = Csw_CutFindFree( p, pObj );
clk = Abc_Clock();
        // assemble the new cut
        if ( !Csw_CutMerge( p, pCut0, pCut1, pCut ) )
        {
            assert( pCut->nFanins == 0 );
            continue;
        }
        // check containment
        if ( Csw_CutFilter( p, pObj, pCut ) )
        {
            assert( pCut->nFanins == 0 );
            continue;
        }
        // create its truth table
        pTruth = Csw_CutComputeTruth( p, pCut, pCut0, pCut1, Aig_ObjFaninC0(pObj), Aig_ObjFaninC1(pObj) );
        // support minimize the truth table
        nFanins = pCut->nFanins;
//        nVars = Csw_CutSupportMinimize( p, pCut ); // leads to quality degradation
        nVars = Kit_TruthSupportSize( pTruth, p->nLeafMax );
p->timeCuts += Abc_Clock() - clk;

        // check for trivial truth tables
        if ( nVars == 0 )
        {
            p->nNodesTriv0++;
            return Aig_NotCond( Aig_ManConst1(p->pManRes), !(pTruth[0] & 1) );
        }
        if ( nVars == 1 )
        {
            p->nNodesTriv1++;
            iVar = Kit_WordFindFirstBit( Kit_TruthSupport(pTruth, p->nLeafMax) );
            assert( iVar < pCut->nFanins );
            return Aig_NotCond( Aig_ManObj(p->pManRes, pCut->pFanins[iVar]), (pTruth[0] & 1) );
        }
        if ( nVars == 2 && nFanins > 2 && fUseResub )
        {
            if ( (pObjNew = Csw_ObjTwoVarCut( p, pCut )) )
            {
                p->nNodesTriv2++;
                return pObjNew;
            }
        }

        // check if an equivalent node with the same cut exists
clk = Abc_Clock();
        pObjNew = pCut->nFanins > 2 ? Csw_TableCutLookup( p, pCut ) : NULL;
p->timeHash += Abc_Clock() - clk;
        if ( pObjNew )
        {
            p->nNodesCuts++;
            return pObjNew;
        }

        // assign the cost
        pCut->Cost = Csw_CutFindCost( p, pCut );
        assert( pCut->nFanins > 0 );
        assert( pCut->Cost > 0 );
    }
    p->nNodesTried++;

    // load the resulting cuts into the table
clk = Abc_Clock();
    Csw_ObjForEachCut( p, pObj, pCut, i )
    {
        if ( pCut->nFanins > 2 )
        {
            assert( pCut->Cost > 0 );
            Csw_TableCutInsert( p, pCut );
        }
    }
p->timeHash += Abc_Clock() - clk;

    // return the node if could not replace it
    return pObj;
}